

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O0

void ZSTD_fillHashTable(ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm)

{
  U32 h;
  uint uVar1;
  U32 *pUVar2;
  BYTE *pBVar3;
  BYTE *p_00;
  size_t hash;
  U32 p;
  size_t hash0;
  U32 curr;
  U32 fastHashFillStep;
  BYTE *iend;
  BYTE *ip;
  BYTE *base;
  U32 mls;
  U32 hBits;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  ZSTD_dictTableLoadMethod_e dtlm_local;
  void *end_local;
  ZSTD_matchState_t *ms_local;
  size_t local_28;
  size_t local_10;
  
  pUVar2 = ms->hashTable;
  h = (ms->cParams).hashLog;
  uVar1 = (ms->cParams).minMatch;
  pBVar3 = (ms->window).base;
  for (iend = pBVar3 + ms->nextToUpdate; iend + 3 < (BYTE *)((long)end - 6U); iend = iend + 3) {
    ip._0_4_ = (int)pBVar3;
    switch(uVar1) {
    default:
      local_10 = ZSTD_hash4Ptr(iend,h);
      break;
    case 5:
      local_10 = ZSTD_hash5Ptr(iend,h);
      break;
    case 6:
      local_10 = ZSTD_hash6Ptr(iend,h);
      break;
    case 7:
      local_10 = ZSTD_hash7Ptr(iend,h);
      break;
    case 8:
      local_10 = ZSTD_hash8Ptr(iend,h);
    }
    pUVar2[local_10] = (int)iend - (int)ip;
    if (dtlm != ZSTD_dtlm_fast) {
      for (hash._4_4_ = 1; hash._4_4_ < 3; hash._4_4_ = hash._4_4_ + 1) {
        p_00 = iend + hash._4_4_;
        switch(uVar1) {
        default:
          local_28 = ZSTD_hash4Ptr(p_00,h);
          break;
        case 5:
          local_28 = ZSTD_hash5Ptr(p_00,h);
          break;
        case 6:
          local_28 = ZSTD_hash6Ptr(p_00,h);
          break;
        case 7:
          local_28 = ZSTD_hash7Ptr(p_00,h);
          break;
        case 8:
          local_28 = ZSTD_hash8Ptr(p_00,h);
        }
        if (pUVar2[local_28] == 0) {
          pUVar2[local_28] = ((int)iend - (int)ip) + hash._4_4_;
        }
      }
    }
  }
  return;
}

Assistant:

void ZSTD_fillHashTable(ZSTD_matchState_t* ms,
                        const void* const end,
                        ZSTD_dictTableLoadMethod_e dtlm)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32  const hBits = cParams->hashLog;
    U32  const mls = cParams->minMatch;
    const BYTE* const base = ms->window.base;
    const BYTE* ip = base + ms->nextToUpdate;
    const BYTE* const iend = ((const BYTE*)end) - HASH_READ_SIZE;
    const U32 fastHashFillStep = 3;

    /* Always insert every fastHashFillStep position into the hash table.
     * Insert the other positions if their hash entry is empty.
     */
    for ( ; ip + fastHashFillStep < iend + 2; ip += fastHashFillStep) {
        U32 const curr = (U32)(ip - base);
        size_t const hash0 = ZSTD_hashPtr(ip, hBits, mls);
        hashTable[hash0] = curr;
        if (dtlm == ZSTD_dtlm_fast) continue;
        /* Only load extra positions for ZSTD_dtlm_full */
        {   U32 p;
            for (p = 1; p < fastHashFillStep; ++p) {
                size_t const hash = ZSTD_hashPtr(ip + p, hBits, mls);
                if (hashTable[hash] == 0) {  /* not yet filled */
                    hashTable[hash] = curr + p;
    }   }   }   }
}